

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::SetUnreachable(TypeChecker *this)

{
  bool bVar1;
  Result result;
  Label *local_20;
  Label *label;
  TypeChecker *this_local;
  
  label = (Label *)this;
  result = TopLabel(this,&local_20);
  bVar1 = Failed(result);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    local_20->unreachable = true;
    ResetTypeStackToLabel(this,local_20);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::SetUnreachable() {
  Label* label;
  CHECK_RESULT(TopLabel(&label));
  label->unreachable = true;
  ResetTypeStackToLabel(label);
  return Result::Ok;
}